

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchGetRootMethodNoFastPath
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  Var pvVar4;
  undefined1 local_78 [8];
  PropertyValueInfo info;
  
  info._60_4_ = propertyId;
  if ((((object->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2113,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_78 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_78,functionBody,inlineCache,inlineCacheIndex,true);
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  pvVar4 = PatchGetMethodFromObject
                     (object,&object->super_RecyclableObject,info._60_4_,
                      (PropertyValueInfo *)local_78,scriptContext,true);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::PatchGetRootMethodNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject* object, PropertyId propertyId)
    {
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        return Js::JavascriptOperators::PatchGetMethodFromObject(object, object, propertyId, &info, functionBody->GetScriptContext(), true);
    }